

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *outpubkey,
                      ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  ptls_iovec_t peerkey_00;
  ptls_iovec_t peerkey_01;
  int iVar1;
  ptls_key_exchange_context_t *ppVar2;
  size_t in_RCX;
  undefined8 in_RDX;
  ptls_key_exchange_context_t **in_RSI;
  uint8_t *in_RDI;
  int ret;
  ptls_key_exchange_context_t *ctx;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ptls_iovec_t *secret_00;
  int release;
  
  release = (int)((ulong)in_RDX >> 0x20);
  secret_00 = (ptls_iovec_t *)0x0;
  *in_RSI = (ptls_key_exchange_context_t *)0x0;
  iVar1 = evp_keyex_create((ptls_key_exchange_algorithm_t *)0x0,
                           (ptls_key_exchange_context_t **)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar1 == 0) {
    ppVar2 = (ptls_key_exchange_context_t *)malloc((size_t)secret_00[1].base);
    *in_RSI = ppVar2;
    if (ppVar2 == (ptls_key_exchange_context_t *)0x0) {
      iVar1 = 0x201;
    }
    else {
      memcpy(*in_RSI,(void *)secret_00->len,(size_t)secret_00[1].base);
      in_RSI[1] = (ptls_key_exchange_context_t *)secret_00[1].base;
      peerkey_00.len = in_RCX;
      peerkey_00.base = in_RDI;
      iVar1 = evp_keyex_on_exchange(in_RSI,release,secret_00,peerkey_00);
      if (secret_00 != (ptls_iovec_t *)0x0) {
        __assert_fail("ctx == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                      ,0x276,
                      "int evp_keyex_exchange(ptls_key_exchange_algorithm_t *, ptls_iovec_t *, ptls_iovec_t *, ptls_iovec_t)"
                     );
      }
      secret_00 = (ptls_iovec_t *)0x0;
    }
  }
  if (secret_00 != (ptls_iovec_t *)0x0) {
    ptls_iovec_init((void *)0x0,0);
    peerkey_01.len = in_RCX;
    peerkey_01.base = in_RDI;
    evp_keyex_on_exchange(in_RSI,release,secret_00,peerkey_01);
  }
  if (iVar1 != 0) {
    free(*in_RSI);
  }
  return iVar1;
}

Assistant:

static int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *outpubkey, ptls_iovec_t *secret,
                              ptls_iovec_t peerkey)
{
    ptls_key_exchange_context_t *ctx = NULL;
    int ret;

    outpubkey->base = NULL;

    if ((ret = evp_keyex_create(algo, &ctx)) != 0)
        goto Exit;
    if ((outpubkey->base = malloc(ctx->pubkey.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(outpubkey->base, ctx->pubkey.base, ctx->pubkey.len);
    outpubkey->len = ctx->pubkey.len;
    ret = evp_keyex_on_exchange(&ctx, 1, secret, peerkey);
    assert(ctx == NULL);

Exit:
    if (ctx != NULL)
        evp_keyex_on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    if (ret != 0)
        free(outpubkey->base);
    return ret;
}